

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationRootElements::getSecondaryBefore(CollationRootElements *this,uint32_t p,uint32_t s)

{
  int32_t iVar1;
  uint local_24;
  uint32_t local_20;
  uint32_t sec;
  uint32_t previousSec;
  int32_t index;
  uint32_t s_local;
  uint32_t p_local;
  CollationRootElements *this_local;
  
  if (p == 0) {
    sec = this->elements[1];
    local_20 = 0;
    local_24 = this->elements[(int)sec];
  }
  else {
    iVar1 = findPrimary(this,p);
    sec = iVar1 + 1;
    local_20 = 0x100;
    local_24 = getFirstSecTerForPrimary(this,sec);
  }
  while (local_24 = local_24 >> 0x10, local_24 < s) {
    local_20 = local_24;
    local_24 = this->elements[(int)sec];
    sec = sec + 1;
  }
  return local_20;
}

Assistant:

uint32_t
CollationRootElements::getSecondaryBefore(uint32_t p, uint32_t s) const {
    int32_t index;
    uint32_t previousSec, sec;
    if(p == 0) {
        index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
        // Gap at the beginning of the secondary CE range.
        previousSec = 0;
        sec = elements[index] >> 16;
    } else {
        index = findPrimary(p) + 1;
        previousSec = Collation::BEFORE_WEIGHT16;
        sec = getFirstSecTerForPrimary(index) >> 16;
    }
    U_ASSERT(s >= sec);
    while(s > sec) {
        previousSec = sec;
        U_ASSERT((elements[index] & SEC_TER_DELTA_FLAG) != 0);
        sec = elements[index++] >> 16;
    }
    U_ASSERT(sec == s);
    return previousSec;
}